

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CColorConverter.cpp
# Opt level: O1

void irr::video::CColorConverter::convert8BitTo24Bit
               (u8 *in,u8 *out,s32 width,s32 height,u8 *palette,s32 linepad,bool flip)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  u8 *puVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  byte *pbVar9;
  
  if (0 < height && (out != (u8 *)0x0 && in != (u8 *)0x0)) {
    uVar3 = (ulong)(width * 3);
    uVar7 = 0;
    uVar8 = uVar3;
    uVar1 = uVar7;
    uVar2 = uVar7;
    if (flip) {
      uVar8 = uVar7;
      uVar1 = (long)(width * 3 * height);
      uVar2 = -uVar3;
    }
    puVar5 = out + uVar1 + uVar2 + 2;
    do {
      if (0 < width) {
        lVar4 = 0;
        do {
          if (palette == (u8 *)0x0) {
            puVar5[lVar4 + -2] = *in;
            puVar5[lVar4 + -1] = *in;
            pbVar9 = in;
          }
          else {
            puVar5[lVar4 + -2] = palette[(ulong)*in * 4 + 2];
            puVar5[lVar4 + -1] = palette[(ulong)*in * 4 + 1];
            pbVar9 = palette + (ulong)*in * 4;
          }
          puVar5[lVar4] = *pbVar9;
          in = in + 1;
          lVar4 = lVar4 + 3;
        } while (lVar4 < (long)uVar3);
      }
      in = in + linepad;
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
      puVar5 = puVar5 + uVar8 + uVar2;
    } while (uVar6 != height);
  }
  return;
}

Assistant:

void CColorConverter::convert8BitTo24Bit(const u8 *in, u8 *out, s32 width, s32 height, const u8 *palette, s32 linepad, bool flip)
{
	if (!in || !out)
		return;

	const s32 lineWidth = 3 * width;
	if (flip)
		out += lineWidth * height;

	for (s32 y = 0; y < height; ++y) {
		if (flip)
			out -= lineWidth; // one line back
		for (s32 x = 0; x < lineWidth; x += 3) {
			if (palette) {
#ifdef __BIG_ENDIAN__
				out[x + 0] = palette[(in[0] << 2) + 0];
				out[x + 1] = palette[(in[0] << 2) + 1];
				out[x + 2] = palette[(in[0] << 2) + 2];
#else
				out[x + 0] = palette[(in[0] << 2) + 2];
				out[x + 1] = palette[(in[0] << 2) + 1];
				out[x + 2] = palette[(in[0] << 2) + 0];
#endif
			} else {
				out[x + 0] = in[0];
				out[x + 1] = in[0];
				out[x + 2] = in[0];
			}
			++in;
		}
		if (!flip)
			out += lineWidth;
		in += linepad;
	}
}